

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<int>_>::value_&&_HasData<vector<int>_>::value,_std::ostream_&>
pbrt::detail::operator<<(ostream *os,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  pointer piVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  
  std::operator<<(os,"[ ");
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = piVar1;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar4 = uVar4 + 1) {
    std::ostream::operator<<(os,piVar1[uVar4]);
    piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (uVar4 < ((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar2 >> 2) - 1U) {
      std::operator<<(os,", ");
      piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
  }
  poVar3 = std::operator<<(os," ]");
  return poVar3;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}